

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O1

int UpnpFileInfo_assign(UpnpFileInfo *p,UpnpFileInfo *q)

{
  UpnpListHead *pUVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  char *s;
  long lVar10;
  sockaddr_storage *psVar11;
  sockaddr_storage *psVar12;
  byte bVar13;
  
  bVar13 = 0;
  if (p != q) {
    p->m_FileLength = q->m_FileLength;
    p->m_LastModified = q->m_LastModified;
    p->m_IsDirectory = q->m_IsDirectory;
    p->m_IsReadable = q->m_IsReadable;
    iVar8 = UpnpFileInfo_set_ContentType(p,q->m_ContentType);
    if (iVar8 == 0) {
      uVar9 = 0;
    }
    else {
      pUVar1 = (q->m_ExtraHeadersList).prev;
      (p->m_ExtraHeadersList).next = (q->m_ExtraHeadersList).next;
      (p->m_ExtraHeadersList).prev = pUVar1;
      psVar11 = &q->m_CtrlPtIPAddr;
      psVar12 = &p->m_CtrlPtIPAddr;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        cVar2 = psVar11->__ss_padding[0];
        cVar3 = psVar11->__ss_padding[1];
        cVar4 = psVar11->__ss_padding[2];
        cVar5 = psVar11->__ss_padding[3];
        cVar6 = psVar11->__ss_padding[4];
        cVar7 = psVar11->__ss_padding[5];
        psVar12->ss_family = psVar11->ss_family;
        psVar12->__ss_padding[0] = cVar2;
        psVar12->__ss_padding[1] = cVar3;
        psVar12->__ss_padding[2] = cVar4;
        psVar12->__ss_padding[3] = cVar5;
        psVar12->__ss_padding[4] = cVar6;
        psVar12->__ss_padding[5] = cVar7;
        psVar11 = (sockaddr_storage *)((long)psVar11 + (ulong)bVar13 * -0x10 + 8);
        psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar13 * -0x10 + 8);
      }
      s = UpnpString_get_String(q->m_Os);
      iVar8 = UpnpString_set_String(p->m_Os,s);
      uVar9 = (uint)(iVar8 != 0);
    }
    return uVar9;
  }
  return 1;
}

Assistant:

int UpnpFileInfo_assign(UpnpFileInfo *p, const UpnpFileInfo *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpFileInfo_set_FileLength(
				   p, UpnpFileInfo_get_FileLength(q));
		ok = ok && UpnpFileInfo_set_LastModified(
				   p, UpnpFileInfo_get_LastModified(q));
		ok = ok && UpnpFileInfo_set_IsDirectory(
				   p, UpnpFileInfo_get_IsDirectory(q));
		ok = ok && UpnpFileInfo_set_IsReadable(
				   p, UpnpFileInfo_get_IsReadable(q));
		ok = ok && UpnpFileInfo_set_ContentType(
				   p, UpnpFileInfo_get_ContentType(q));
		ok = ok && UpnpFileInfo_set_ExtraHeadersList(
				   p, UpnpFileInfo_get_ExtraHeadersList(q));
		ok = ok && UpnpFileInfo_set_CtrlPtIPAddr(
				   p, UpnpFileInfo_get_CtrlPtIPAddr(q));
		ok = ok && UpnpFileInfo_set_Os(p, UpnpFileInfo_get_Os(q));
	}

	return ok;
}